

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileByName(DescriptorPool *this,string *name)

{
  scoped_ptr<google::protobuf::DescriptorPool::Tables> *this_00;
  bool bVar1;
  Tables *pTVar2;
  FileDescriptor *pFVar3;
  MutexLockMaybe lock;
  MutexLockMaybe MStack_28;
  
  internal::MutexLockMaybe::MutexLockMaybe(&MStack_28,this->mutex_);
  this_00 = &this->tables_;
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&pTVar2->known_bad_symbols_);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&pTVar2->known_bad_files_);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
  pFVar3 = Tables::FindFile(pTVar2,name);
  if (pFVar3 == (FileDescriptor *)0x0) {
    if (this->underlay_ != (DescriptorPool *)0x0) {
      pFVar3 = FindFileByName(this->underlay_,name);
      if (pFVar3 != (FileDescriptor *)0x0) goto LAB_002dcff6;
    }
    bVar1 = TryFindFileInFallbackDatabase(this,name);
    if (bVar1) {
      pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
      pFVar3 = Tables::FindFile(pTVar2,name);
      if (pFVar3 != (FileDescriptor *)0x0) goto LAB_002dcff6;
    }
    pFVar3 = (FileDescriptor *)0x0;
  }
LAB_002dcff6:
  internal::MutexLockMaybe::~MutexLockMaybe(&MStack_28);
  return pFVar3;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileByName(const string& name) const {
  MutexLockMaybe lock(mutex_);
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  const FileDescriptor* result = tables_->FindFile(name);
  if (result != NULL) return result;
  if (underlay_ != NULL) {
    result = underlay_->FindFileByName(name);
    if (result != NULL) return result;
  }
  if (TryFindFileInFallbackDatabase(name)) {
    result = tables_->FindFile(name);
    if (result != NULL) return result;
  }
  return NULL;
}